

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::SimpleTypeHandler<6UL>::IsObjTypeSpecEquivalent
          (SimpleTypeHandler<6UL> *this,Type *type,EquivalentPropertyEntry *entry)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  PropertyIndex PVar4;
  bool bVar5;
  
  if ((long)this->propertyCount < 1) {
    if ((entry->slotIndex != 0xffff) || (entry->mustBeWritable != false)) {
      return false;
    }
  }
  else {
    uVar3 = 0;
    bVar5 = (this->super_DynamicTypeHandler).inlineSlotCapacity == 0;
    uVar2 = (ulong)((this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3);
    if (bVar5) {
      uVar2 = uVar3;
    }
    for (; (long)this->propertyCount * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
      if (entry->propertyId == *(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + uVar3) + 8))
      {
        bVar1 = *(byte *)((long)&this->descriptors[0].field_1 + uVar3);
        PVar4 = entry->slotIndex;
        if ((bVar1 & 8) != 0) goto LAB_00cc1c06;
        if ((PropertyIndex)uVar2 != PVar4) {
          return false;
        }
        if (entry->isAuxSlot != bVar5) {
          return false;
        }
        if ((bVar1 & 4) == 0) goto LAB_00cc1c0d;
      }
      else {
        PVar4 = entry->slotIndex;
LAB_00cc1c06:
        if (PVar4 != 0xffff) {
          return false;
        }
LAB_00cc1c0d:
        if (entry->mustBeWritable != false) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool SimpleTypeHandler<size>::IsObjTypeSpecEquivalent(const Type* type, const EquivalentPropertyEntry *entry)
    {
        if (this->propertyCount > 0)
        {
            for (int i = 0; i < this->propertyCount; i++)
            {
                SimplePropertyDescriptor* descriptor = &this->descriptors[i];
                Js::PropertyId propertyId = descriptor->Id->GetPropertyId();

                if (entry->propertyId == propertyId && !(descriptor->Attributes & PropertyDeleted))
                {
                    Js::PropertyIndex relSlotIndex = AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(0));
                    if (relSlotIndex != entry->slotIndex ||
                        entry->isAuxSlot != (GetInlineSlotCapacity() == 0) ||
                        (entry->mustBeWritable && !(descriptor->Attributes & PropertyWritable)))
                    {
                        return false;
                    }
                }
                else
                {
                    if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
                    {
                        return false;
                    }
                }
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }